

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pollq_epoll.c
# Opt level: O0

void nni_epoll_pq_destroy(nni_posix_pollq *pq)

{
  ssize_t sVar1;
  undefined8 local_18;
  uint64_t one;
  nni_posix_pollq *pq_local;
  
  local_18 = 1;
  if ((pq->init & 1U) != 0) {
    one = (uint64_t)pq;
    nni_mtx_lock(&pq->mtx);
    *(undefined1 *)(one + 0x68) = 1;
    sVar1 = write(*(int *)(one + 100),&local_18,8);
    if (sVar1 != 8) {
      nni_panic("BUG! unable to write to evfd!");
    }
    nni_mtx_unlock((nni_mtx *)one);
    nni_thr_fini((nni_thr *)(one + 0x70));
    close(*(int *)(one + 100));
    close(*(int *)(one + 0x60));
    nni_mtx_fini((nni_mtx *)one);
  }
  return;
}

Assistant:

static void
nni_epoll_pq_destroy(nni_posix_pollq *pq)
{
	uint64_t one = 1;

	if (pq->init) {
		nni_mtx_lock(&pq->mtx);
		pq->close = true;

		if (write(pq->evfd, &one, sizeof(one)) != sizeof(one)) {
			// This should never occur, and if it does it could
			// lead to a hang.
			nni_panic("BUG! unable to write to evfd!");
		}
		nni_mtx_unlock(&pq->mtx);

		nni_thr_fini(&pq->thr);

		close(pq->evfd);
		close(pq->epfd);

		nni_mtx_fini(&pq->mtx);
	}
}